

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  code *in_RCX;
  long lVar5;
  Mat *in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int c_1;
  Option opt_g;
  int j;
  float *ptr;
  int i;
  float *outptr;
  int c;
  int inner_outh;
  int inner_outw;
  int inner_h;
  int inner_w;
  int y;
  int x;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int outh;
  int outw;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  Mat bottom_blob_bordered;
  int kernel_extent;
  int dilation;
  int stride;
  int kernel_size;
  size_t elemsize;
  int h;
  int w;
  float in_stack_00000574;
  int in_stack_00000578;
  int in_stack_0000057c;
  int in_stack_00000580;
  int in_stack_00000584;
  Mat *in_stack_00000588;
  Mat *in_stack_00000590;
  int in_stack_000005a0;
  Option *in_stack_000005a8;
  Mat *in_stack_fffffffffffffc50;
  Mat *in_stack_fffffffffffffc58;
  float *in_stack_fffffffffffffc60;
  float *in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int local_33c;
  Mat local_338;
  float *local_2f8;
  int local_2ec;
  Mat local_2e8;
  Mat *local_2a8;
  int local_29c;
  undefined1 local_298 [8];
  Allocator *local_290;
  int local_26c;
  Mat local_268;
  float *local_228;
  int local_21c;
  Mat local_218;
  float *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  Mat local_1b0;
  Mat local_170;
  int local_130;
  int local_12c;
  undefined1 local_128 [48];
  Mat local_f8;
  undefined1 local_b8 [84];
  int local_64;
  int local_60;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  undefined8 *local_30;
  code *local_28;
  Mat *local_18;
  int local_4;
  
  local_34 = in_RSI->w;
  local_38 = in_RSI->h;
  local_40 = in_RSI->elemsize;
  local_44 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84);
  local_48 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94);
  local_4c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c);
  local_50 = local_4c * (local_44 + -1) + 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  Mat::Mat((Mat *)(local_b8 + 0x28),in_RSI);
  if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) < 1) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) < 1)) &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) < 1)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) < 1)) {
    if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xe9) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xe9)) &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) == -0xe9 &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) == -0xe9)))) {
      local_f8.w = (local_50 + ((local_34 + -1) / local_48) * local_48) - local_34;
      local_f8.dims = (local_50 + ((local_38 + -1) / local_48) * local_48) - local_38;
      if ((0 < local_f8.w) || (0 < local_f8.dims)) {
        local_f8.allocator = (Allocator *)local_30[4];
        local_f8.data = (void *)*local_30;
        local_f8.elemsize = local_30[2];
        local_f8._24_8_ = local_30[3];
        local_f8.refcount = (int *)local_30[2];
        in_stack_fffffffffffffc50 = &local_f8;
        copy_make_border(in_stack_00000590,in_stack_00000588,in_stack_00000584,in_stack_00000580,
                         in_stack_0000057c,in_stack_00000578,in_stack_000005a0,in_stack_00000574,
                         in_stack_000005a8);
        bVar1 = Mat::empty(in_stack_fffffffffffffc50);
        if (bVar1) {
          local_4 = -100;
          local_f8.h = 1;
          goto LAB_00149e02;
        }
      }
      local_34 = local_64;
      local_38 = local_60;
    }
    else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xea) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xea)) &&
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) == -0xea &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) == -0xea)))) {
      local_128._44_4_ = (local_50 + ((local_34 + -1) / local_48) * local_48) - local_34;
      local_128._40_4_ = (local_50 + ((local_38 + -1) / local_48) * local_48) - local_38;
      if ((0 < (int)local_128._44_4_) || (0 < (int)local_128._40_4_)) {
        local_128._32_8_ = local_30[4];
        local_128._0_8_ = *local_30;
        local_128._16_8_ = local_30[2];
        local_128._24_8_ = local_30[3];
        local_128._8_8_ = local_30[2];
        in_stack_fffffffffffffc50 = (Mat *)local_128;
        copy_make_border(in_stack_00000590,in_stack_00000588,in_stack_00000584,in_stack_00000580,
                         in_stack_0000057c,in_stack_00000578,in_stack_000005a0,in_stack_00000574,
                         in_stack_000005a8);
        bVar1 = Mat::empty(in_stack_fffffffffffffc50);
        if (bVar1) {
          local_4 = -100;
          local_f8.h = 1;
          goto LAB_00149e02;
        }
      }
      local_34 = local_64;
      local_38 = local_60;
    }
  }
  else {
    local_b8._32_8_ = local_30[4];
    local_b8._0_8_ = *local_30;
    local_b8._16_8_ = local_30[2];
    local_b8._24_8_ = local_30[3];
    local_b8._8_8_ = local_30[2];
    in_stack_fffffffffffffc50 = (Mat *)local_b8;
    copy_make_border(in_stack_00000590,in_stack_00000588,in_stack_00000584,in_stack_00000580,
                     in_stack_0000057c,in_stack_00000578,in_stack_000005a0,in_stack_00000574,
                     in_stack_000005a8);
    bVar1 = Mat::empty(in_stack_fffffffffffffc50);
    if (bVar1) {
      local_4 = -100;
      local_f8.h = 1;
      goto LAB_00149e02;
    }
    local_34 = local_64;
    local_38 = local_60;
  }
  local_12c = (local_34 - local_50) / local_48 + 1;
  local_130 = (local_38 - local_50) / local_48 + 1;
  Mat::create(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
              (int)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
              (size_t)in_stack_fffffffffffffc58,(Allocator *)in_stack_fffffffffffffc50);
  bVar1 = Mat::empty(in_stack_fffffffffffffc50);
  if (bVar1) {
    local_4 = -100;
    local_f8.h = 1;
  }
  else {
    Mat::Mat(&local_170);
    Mat::Mat(&local_1b0);
    for (local_1b4 = 0; local_1b4 < local_4c; local_1b4 = local_1b4 + 1) {
      for (local_1b8 = 0; local_1b8 < local_4c; local_1b8 = local_1b8 + 1) {
        local_1bc = ((local_34 - local_1b8) + -1 + local_4c) / local_4c;
        local_1c0 = ((local_38 - local_1b4) + -1 + local_4c) / local_4c;
        local_1c4 = (local_1bc - local_44) / local_48 + 1;
        local_1c8 = (local_1c0 - local_44) / local_48 + 1;
        Mat::create(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                    (int)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                    (size_t)in_stack_fffffffffffffc58,(Allocator *)in_stack_fffffffffffffc50);
        bVar1 = Mat::empty(in_stack_fffffffffffffc50);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00149dca;
        }
        Mat::create(in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                    (int)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                    (size_t)in_stack_fffffffffffffc58,(Allocator *)in_stack_fffffffffffffc50);
        bVar1 = Mat::empty(in_stack_fffffffffffffc50);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00149dca;
        }
        for (local_1cc = 0; local_1cc < local_18->c; local_1cc = local_1cc + 1) {
          Mat::channel(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_218);
          Mat::~Mat((Mat *)0x1498d3);
          local_1d8 = pfVar2;
          for (local_21c = 0; local_21c < local_1c0; local_21c = local_21c + 1) {
            Mat::channel(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_268);
            iVar3 = local_4c * local_21c * local_34;
            iVar4 = local_1b4 * local_34;
            lVar5 = (long)local_1b8;
            Mat::~Mat((Mat *)0x149991);
            for (local_26c = 0; local_26c < local_1bc; local_26c = local_26c + 1) {
              local_1d8[local_26c] = (pfVar2 + (long)iVar3 + iVar4 + lVar5)[local_26c * local_4c];
            }
            local_1d8 = local_1d8 + local_1bc;
            local_228 = pfVar2 + (long)iVar3 + iVar4 + lVar5;
          }
        }
        memcpy(local_298,local_30,0x28);
        local_290 = local_1b0.allocator;
        if (local_44 == 7) {
          (*local_28)(&local_170,&local_1b0,in_RDI + 0xb,
                      (long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140,local_298);
        }
        else {
          (*local_28)(&local_170,&local_1b0,(long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100,
                      (long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140,local_298);
        }
        for (local_29c = 0; local_29c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80);
            local_29c = local_29c + 1) {
          Mat::channel(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_2e8);
          in_stack_fffffffffffffc70 =
               (Mat *)(pfVar2 + (long)(local_1b4 * local_12c) + (long)local_1b8);
          Mat::~Mat((Mat *)0x149bf2);
          local_2a8 = in_stack_fffffffffffffc70;
          for (local_2ec = 0; local_2ec < local_1c8; local_2ec = local_2ec + 1) {
            Mat::channel(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
            in_stack_fffffffffffffc68 = Mat::operator_cast_to_float_(&local_338);
            in_stack_fffffffffffffc60 = in_stack_fffffffffffffc68 + local_2ec * local_1c4;
            Mat::~Mat((Mat *)0x149c80);
            for (local_33c = 0; local_33c < local_1c4; local_33c = local_33c + 1) {
              *(float *)((long)&local_2a8->data + (long)(local_33c * local_4c) * 4) =
                   in_stack_fffffffffffffc60[local_33c];
            }
            local_2a8 = (Mat *)((long)&local_2a8->data + (long)(local_4c * local_12c) * 4);
            local_2f8 = in_stack_fffffffffffffc60;
          }
        }
      }
    }
    local_4 = 0;
LAB_00149dca:
    local_f8.h = 1;
    Mat::~Mat((Mat *)0x149dd7);
    Mat::~Mat((Mat *)0x149de4);
  }
LAB_00149e02:
  Mat::~Mat((Mat *)0x149e0f);
  return local_4;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            if (kernel_size == 7)
            {
            // FIXME conv7x7s1_sse use sgemm
            conv(inner_bottom_blob, inner_top_blob, weight_sgemm_data, bias_data, opt_g);
            }
            else
            {
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}